

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherInotify.cpp
# Opt level: O1

void __thiscall efsw::FileWatcherInotify::run(FileWatcherInotify *this)

{
  size_type *psVar1;
  undefined4 uVar2;
  uint uVar3;
  _Base_ptr p_Var4;
  pointer ppVar5;
  WatcherInotify *pWVar6;
  Watcher *pWVar7;
  pointer pcVar8;
  undefined8 this_00;
  Watcher **ppWVar9;
  int iVar10;
  int iVar11;
  ssize_t sVar12;
  long lVar13;
  size_t sVar14;
  long *plVar15;
  _Rb_tree_node_base *p_Var16;
  Watcher **ppWVar17;
  pointer ppVar18;
  Watcher *pWVar19;
  _Rb_tree_node_base *p_Var20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  _Alloc_hider _Var22;
  WatcherInotify *pWVar23;
  undefined8 uVar24;
  _Alloc_hider _Var25;
  pointer ppVar26;
  bool bVar27;
  pair<efsw::Watcher_**,_long> pVar28;
  Watcher *oldWatch;
  Lock lock;
  vector<efsw::Watcher_*,_std::allocator<efsw::Watcher_*>_> eraseWatches;
  string prevOldFileName;
  vector<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  movedOutsideWatches;
  timeval timeout;
  fd_set rfds;
  int local_274;
  undefined1 local_270 [8];
  _Alloc_hider local_268;
  undefined1 local_260 [64];
  _Alloc_hider local_220;
  Watcher **local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_210;
  void *local_1f8;
  _Alloc_hider local_1f0;
  undefined1 local_1e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  undefined1 *local_1c8;
  long local_1c0;
  undefined1 local_1b8 [16];
  vector<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1a8;
  ssize_t local_190;
  undefined1 *local_188 [2];
  undefined1 local_178 [16];
  string local_168;
  undefined1 *local_148 [2];
  undefined1 local_138 [16];
  timeval local_128;
  string local_118;
  undefined1 *local_f8 [2];
  undefined1 local_e8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  fd_set local_b8;
  
  local_1f8 = operator_new__(0x404000);
  _Var22._M_p = (pointer)0x0;
  memset(local_1f8,0,0x404000);
  local_1c8 = local_1b8;
  local_1c0 = 0;
  local_1b8[0] = 0;
  local_260._48_8_ = &this->mMovedOutsideWatches;
  local_260._56_8_ = &this->mWatchesLock;
  _Var25._M_p = (pointer)&(this->mWatches)._M_t._M_impl.super__Rb_tree_header;
  local_274 = -1;
  p_Var16 = (_Rb_tree_node_base *)0x0;
  local_260._36_4_ = 0;
  local_260._40_8_ = this;
  local_220._M_p = _Var25._M_p;
  do {
    local_b8.fds_bits[0xe] = 0;
    local_b8.fds_bits[0xf] = 0;
    local_b8.fds_bits[0xc] = 0;
    local_b8.fds_bits[0xd] = 0;
    local_b8.fds_bits[10] = 0;
    local_b8.fds_bits[0xb] = 0;
    local_b8.fds_bits[8] = 0;
    local_b8.fds_bits[9] = 0;
    local_b8.fds_bits[6] = 0;
    local_b8.fds_bits[7] = 0;
    local_b8.fds_bits[4] = 0;
    local_b8.fds_bits[5] = 0;
    local_b8.fds_bits[2] = 0;
    local_b8.fds_bits[3] = 0;
    local_b8.fds_bits[0] = 0;
    local_b8.fds_bits[1] = 0;
    iVar11 = this->mFD;
    iVar10 = iVar11 + 0x3f;
    if (-1 < iVar11) {
      iVar10 = iVar11;
    }
    local_b8.fds_bits[iVar10 >> 6] =
         local_b8.fds_bits[iVar10 >> 6] | 1L << ((byte)(iVar11 % 0x40) & 0x3f);
    local_128.tv_sec = 0;
    local_128.tv_usec = 100000;
    iVar11 = select(0x400,&local_b8,(fd_set *)0x0,(fd_set *)0x0,&local_128);
    if (iVar11 < 1) {
      local_274 = -1;
      if ((WatcherInotify *)_Var22._M_p != (WatcherInotify *)0x0) {
        local_268._M_p = local_260 + 8;
        pcVar8 = (((WatcherInotify *)_Var22._M_p)->super_Watcher).OldFileName._M_dataplus._M_p;
        local_270 = (undefined1  [8])_Var22._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_268,pcVar8,
                   pcVar8 + (((WatcherInotify *)_Var22._M_p)->super_Watcher).OldFileName.
                            _M_string_length);
        std::
        vector<std::pair<efsw::WatcherInotify*,std::__cxx11::string>,std::allocator<std::pair<efsw::WatcherInotify*,std::__cxx11::string>>>
        ::emplace_back<std::pair<efsw::WatcherInotify*,std::__cxx11::string>>
                  ((vector<std::pair<efsw::WatcherInotify*,std::__cxx11::string>,std::allocator<std::pair<efsw::WatcherInotify*,std::__cxx11::string>>>
                    *)local_260._48_8_,
                   (pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_270);
        if (local_268._M_p != local_260 + 8) {
          operator_delete(local_268._M_p);
        }
      }
      _Var22._M_p = (pointer)0x0;
    }
    else {
      sVar12 = read(this->mFD,local_1f8,0x404000);
      if (0 < sVar12) {
        pWVar23 = (WatcherInotify *)0x0;
        local_190 = sVar12;
        do {
          Mutex::lock((Mutex *)local_260._56_8_);
          ppVar26 = (pointer)((long)local_1f8 + (long)pWVar23);
          lVar13 = (long)*(int *)&ppVar26->first;
          p_Var20 = (_Rb_tree_node_base *)_Var25._M_p;
          for (p_Var16 = (this->mWatches)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              p_Var16 != (_Rb_tree_node_base *)0x0;
              p_Var16 = (&p_Var16->_M_left)[*(long *)(p_Var16 + 1) < lVar13]) {
            if (lVar13 <= *(long *)(p_Var16 + 1)) {
              p_Var20 = p_Var16;
            }
          }
          p_Var16 = (_Rb_tree_node_base *)_Var25._M_p;
          if ((p_Var20 != (_Rb_tree_node_base *)_Var25._M_p) &&
             (p_Var16 = p_Var20, lVar13 < *(long *)(p_Var20 + 1))) {
            p_Var16 = (_Rb_tree_node_base *)_Var25._M_p;
          }
          Mutex::unlock((Mutex *)local_260._56_8_);
          local_260._24_8_ = ppVar26;
          local_1f0._M_p = (pointer)pWVar23;
          if (p_Var16 != (_Rb_tree_node_base *)_Var25._M_p) {
            p_Var4 = p_Var16[1]._M_parent;
            psVar1 = &(ppVar26->second)._M_string_length;
            local_270 = (undefined1  [8])local_260;
            sVar14 = strlen((char *)psVar1);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_270,psVar1,(long)&(ppVar26->second)._M_string_length + sVar14
                      );
            uVar2 = *(undefined4 *)((long)&ppVar26->first + 4);
            local_148[0] = local_138;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"");
            (**(code **)(*(long *)local_260._40_8_ + 0x30))
                      (local_260._40_8_,p_Var4,local_270,uVar2,(string *)local_148);
            if (local_148[0] != local_138) {
              operator_delete(local_148[0]);
            }
            _Var25._M_p = local_220._M_p;
            this = (FileWatcherInotify *)local_260._40_8_;
            if (local_270 != (undefined1  [8])local_260) {
              operator_delete((void *)local_270);
            }
            uVar3 = *(uint *)((long)(WatcherInotify **)local_260._24_8_ + 4);
            if ((((char)uVar3 < '\0') &&
                ((WatcherInotify *)p_Var16[1]._M_parent == (WatcherInotify *)_Var22._M_p)) &&
               (*(int *)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (local_260._24_8_ + 8))->_M_dataplus)._M_p == local_274)) {
LAB_0010b73e:
              local_274 = -1;
              _Var22._M_p = (pointer)0x0;
              ppVar26 = (pointer)local_260._24_8_;
            }
            else if ((uVar3 & 0x40) == 0) {
              local_274 = -1;
              if ((WatcherInotify *)_Var22._M_p == (WatcherInotify *)0x0) goto LAB_0010b73e;
              local_268._M_p = local_260 + 8;
              local_270 = (undefined1  [8])_Var22._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_268,local_1c8,local_1c8 + local_1c0);
              std::
              vector<std::pair<efsw::WatcherInotify*,std::__cxx11::string>,std::allocator<std::pair<efsw::WatcherInotify*,std::__cxx11::string>>>
              ::emplace_back<std::pair<efsw::WatcherInotify*,std::__cxx11::string>>
                        ((vector<std::pair<efsw::WatcherInotify*,std::__cxx11::string>,std::allocator<std::pair<efsw::WatcherInotify*,std::__cxx11::string>>>
                          *)local_260._48_8_,
                         (pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_270);
              ppVar26 = (pointer)local_260._24_8_;
              if (local_268._M_p != local_260 + 8) {
                operator_delete(local_268._M_p);
              }
              _Var22._M_p = (pointer)0x0;
            }
            else {
              if (((local_260._36_4_ & 1) != 0) &&
                 ((WatcherInotify *)_Var22._M_p != (WatcherInotify *)0x0)) {
                local_268._M_p = local_260 + 8;
                local_270 = (undefined1  [8])_Var22._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_268,local_1c8,local_1c8 + local_1c0);
                std::
                vector<std::pair<efsw::WatcherInotify*,std::__cxx11::string>,std::allocator<std::pair<efsw::WatcherInotify*,std::__cxx11::string>>>
                ::emplace_back<std::pair<efsw::WatcherInotify*,std::__cxx11::string>>
                          ((vector<std::pair<efsw::WatcherInotify*,std::__cxx11::string>,std::allocator<std::pair<efsw::WatcherInotify*,std::__cxx11::string>>>
                            *)local_260._48_8_,
                           (pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_270);
                if (local_268._M_p != local_260 + 8) {
                  operator_delete(local_268._M_p);
                }
              }
              _Var22._M_p = (pointer)p_Var16[1]._M_parent;
              local_274 = *(int *)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(local_260._24_8_ + 8))->_M_dataplus)._M_p;
              ppVar26 = (pointer)local_260._24_8_;
            }
          }
          local_260._36_4_ = *(uint *)((long)&ppVar26->first + 4) & 0x40;
          if (local_260._36_4_ != 0) {
            psVar1 = &(ppVar26->second)._M_string_length;
            local_270 = (undefined1  [8])local_260;
            sVar14 = strlen((char *)psVar1);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_270,psVar1,(long)&(ppVar26->second)._M_string_length + sVar14
                      );
            std::__cxx11::string::operator=((string *)&local_1c8,(string *)local_270);
            _Var25._M_p = local_220._M_p;
            ppVar26 = (pointer)local_260._24_8_;
            if (local_270 != (undefined1  [8])local_260) {
              operator_delete((void *)local_270);
              _Var25._M_p = local_220._M_p;
              ppVar26 = (pointer)local_260._24_8_;
            }
          }
          local_260._36_4_ = (uint)local_260._36_4_ >> 6;
          pWVar23 = (WatcherInotify *)
                    (local_1f0._M_p +
                    (ulong)*(uint *)((long)&(ppVar26->second)._M_dataplus._M_p + 4) + 0x10);
        } while ((long)pWVar23 < local_190);
      }
    }
    if ((this->mMovedOutsideWatches).
        super__Vector_base<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->mMovedOutsideWatches).
        super__Vector_base<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector(&local_1a8,
               (vector<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_260._48_8_);
      ppVar26 = local_1a8.
                super__Vector_base<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_1f0._M_p = _Var22._M_p;
      if (local_1a8.
          super__Vector_base<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_1a8.
          super__Vector_base<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          ppVar18 = (this->mMovedOutsideWatches).
                    super__Vector_base<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppVar5 = (this->mMovedOutsideWatches).
                   super__Vector_base<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if ((long)ppVar5 - (long)ppVar18 ==
              (long)local_1a8.
                    super__Vector_base<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_1a8.
                    super__Vector_base<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
LAB_0010b8ab:
            pWVar23 = ppVar26->first;
            local_218 = (Watcher **)0x0;
            aStack_210._M_allocated_capacity = 0;
            aStack_210._8_8_ = (Watcher **)0x0;
            Mutex::lock((Mutex *)local_260._56_8_);
            local_260._24_8_ = ppVar26;
            if (p_Var16 != (_Rb_tree_node_base *)_Var25._M_p) {
              do {
                pWVar6 = (WatcherInotify *)p_Var16[1]._M_parent;
                local_270 = (undefined1  [8])pWVar6;
                if (pWVar6 == pWVar23) {
                  bVar27 = false;
                }
                else {
                  std::operator+(&local_d8,&(pWVar23->super_Watcher).Directory,&ppVar26->second);
                  plVar15 = (long *)std::__cxx11::string::append((char *)&local_d8);
                  local_1e8._0_8_ = &local_1d8;
                  paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(plVar15 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar15 == paVar21) {
                    local_1d8._M_allocated_capacity = paVar21->_M_allocated_capacity;
                    local_1d8._8_8_ = plVar15[3];
                  }
                  else {
                    local_1d8._M_allocated_capacity = paVar21->_M_allocated_capacity;
                    local_1e8._0_8_ =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)*plVar15;
                  }
                  local_1e8._8_8_ = plVar15[1];
                  *plVar15 = (long)paVar21;
                  plVar15[1] = 0;
                  *(undefined1 *)(plVar15 + 2) = 0;
                  iVar11 = String::strStartsWith
                                     ((string *)local_1e8,(string *)((long)local_270 + 0x10));
                  bVar27 = iVar11 != -1;
                }
                _Var25._M_p = local_220._M_p;
                if (pWVar6 != pWVar23) {
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1e8._0_8_ != &local_1d8) {
                    operator_delete((void *)local_1e8._0_8_);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                    operator_delete(local_d8._M_dataplus._M_p);
                  }
                }
                if (bVar27) {
                  if (aStack_210._M_allocated_capacity == aStack_210._8_8_) {
                    std::vector<efsw::Watcher*,std::allocator<efsw::Watcher*>>::
                    _M_realloc_insert<efsw::Watcher*const&>
                              ((vector<efsw::Watcher*,std::allocator<efsw::Watcher*>> *)&local_218,
                               (iterator)aStack_210._M_allocated_capacity,(Watcher **)local_270);
                  }
                  else {
                    *(undefined1 (*) [8])aStack_210._M_allocated_capacity = local_270;
                    aStack_210._M_allocated_capacity = aStack_210._M_allocated_capacity + 8;
                  }
                }
                p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16);
              } while (p_Var16 != (_Rb_tree_node_base *)_Var25._M_p);
            }
            Mutex::unlock((Mutex *)local_260._56_8_);
            uVar24 = aStack_210._M_allocated_capacity;
            ppWVar9 = local_218;
            if (local_218 != (Watcher **)aStack_210._M_allocated_capacity) {
              lVar13 = (long)(aStack_210._M_allocated_capacity - (long)local_218) >> 3;
              pVar28 = std::get_temporary_buffer<efsw::Watcher*>
                                 ((lVar13 - (lVar13 + 1 >> 0x3f)) + 1 >> 1);
              ppWVar17 = pVar28.first;
              if (ppWVar17 == (Watcher **)0x0) {
                std::
                __inplace_stable_sort<__gnu_cxx::__normal_iterator<efsw::Watcher**,std::vector<efsw::Watcher*,std::allocator<efsw::Watcher*>>>,__gnu_cxx::__ops::_Iter_comp_iter<efsw::FileWatcherInotify::run()::__0>>
                          (ppWVar9,uVar24);
              }
              else {
                std::
                __stable_sort_adaptive<__gnu_cxx::__normal_iterator<efsw::Watcher**,std::vector<efsw::Watcher*,std::allocator<efsw::Watcher*>>>,efsw::Watcher**,long,__gnu_cxx::__ops::_Iter_comp_iter<efsw::FileWatcherInotify::run()::__0>>
                          (ppWVar9,uVar24,ppWVar17,pVar28.second);
              }
              operator_delete(ppWVar17);
            }
            if (local_218 == (Watcher **)aStack_210._M_allocated_capacity) {
              local_f8[0] = local_e8;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"");
              (**(code **)(*(long *)local_260._40_8_ + 0x30))
                        (local_260._40_8_,pWVar23,&ppVar26->second,0x200,(string *)local_f8);
              this = (FileWatcherInotify *)local_260._40_8_;
              if (local_f8[0] != local_e8) {
                operator_delete(local_f8[0]);
              }
            }
            else {
              this = (FileWatcherInotify *)local_260._40_8_;
              uVar24 = aStack_210._M_allocated_capacity;
              if ((Watcher **)aStack_210._M_allocated_capacity != local_218) {
                do {
                  this_00 = local_260._40_8_;
                  pWVar7 = *(Watcher **)(uVar24 + -8);
                  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
                  pcVar8 = (pWVar7->Directory)._M_dataplus._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_168,pcVar8,
                             pcVar8 + (pWVar7->Directory)._M_string_length);
                  pWVar19 = watcherContainsDirectory((FileWatcherInotify *)this_00,&local_168);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_168._M_dataplus._M_p != &local_168.field_2) {
                    operator_delete(local_168._M_dataplus._M_p);
                  }
                  if (pWVar19 != (Watcher *)0x0) {
                    pcVar8 = (pWVar7->Directory)._M_dataplus._M_p;
                    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_118,pcVar8,
                               pcVar8 + (pWVar7->Directory)._M_string_length);
                    FileSystem::fileNameFromPath((string *)local_270,&local_118);
                    local_188[0] = local_178;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"");
                    (**(code **)(*(long *)local_260._40_8_ + 0x30))
                              (local_260._40_8_,pWVar19,local_270,0x200,(string *)local_188);
                    if (local_188[0] != local_178) {
                      operator_delete(local_188[0]);
                    }
                    if (local_270 != (undefined1  [8])local_260) {
                      operator_delete((void *)local_270);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_118._M_dataplus._M_p != &local_118.field_2) {
                      operator_delete(local_118._M_dataplus._M_p);
                    }
                  }
                  uVar24 = uVar24 + -8;
                  this = (FileWatcherInotify *)local_260._40_8_;
                } while ((Watcher **)uVar24 != local_218);
              }
            }
            _Var22._M_p = local_1f0._M_p;
            _Var25._M_p = local_220._M_p;
            ppVar26 = (pointer)local_260._24_8_;
            if (local_218 != (Watcher **)0x0) {
              operator_delete(local_218);
              _Var22._M_p = local_1f0._M_p;
              _Var25._M_p = local_220._M_p;
              ppVar26 = (pointer)local_260._24_8_;
            }
          }
          else if (ppVar5 != ppVar18) {
            do {
              if (ppVar18->first == ppVar26->first) goto LAB_0010b8ab;
              ppVar18 = ppVar18 + 1;
            } while (ppVar18 != ppVar5);
          }
          ppVar26 = ppVar26 + 1;
        } while (ppVar26 !=
                 local_1a8.
                 super__Vector_base<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      std::
      vector<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::clear((vector<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_260._48_8_);
      std::
      vector<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&local_1a8);
    }
    if (((this->super_FileWatcherImpl).mInitOK.set_._M_base._M_i & 1U) == 0) {
      operator_delete__(local_1f8);
      if (local_1c8 != local_1b8) {
        operator_delete(local_1c8);
      }
      return;
    }
  } while( true );
}

Assistant:

void FileWatcherInotify::run() {
	char* buff = new char[BUFF_SIZE];
	memset( buff, 0, BUFF_SIZE );
	WatchMap::iterator wit;

	WatcherInotify* currentMoveFrom = NULL;
	u_int32_t currentMoveCookie = -1;
	bool lastWasMovedFrom = false;
	std::string prevOldFileName;

	do {
		fd_set rfds;
		FD_ZERO( &rfds );
		FD_SET( mFD, &rfds );
		timeval timeout;
		timeout.tv_sec = 0;
		timeout.tv_usec = 100000;

		if ( select( FD_SETSIZE, &rfds, NULL, NULL, &timeout ) > 0 ) {
			ssize_t len;

			len = read( mFD, buff, BUFF_SIZE );

			if ( len != -1 ) {
				ssize_t i = 0;

				while ( i < len ) {
					struct inotify_event* pevent = (struct inotify_event*)&buff[i];

					{
						{
							Lock lock( mWatchesLock );

							wit = mWatches.find( pevent->wd );
						}

						if ( wit != mWatches.end() ) {
							handleAction( wit->second, (char*)pevent->name, pevent->mask );

							if ( ( pevent->mask & IN_MOVED_TO ) && wit->second == currentMoveFrom &&
								 pevent->cookie == currentMoveCookie ) {
								/// make pair success
								currentMoveFrom = NULL;
								currentMoveCookie = -1;
							} else if ( pevent->mask & IN_MOVED_FROM ) {
								// Previous event was moved from and current event is moved from
								// Treat it as a DELETE or moved ouside watches
								if ( lastWasMovedFrom && currentMoveFrom ) {
									mMovedOutsideWatches.push_back(
										std::make_pair( currentMoveFrom, prevOldFileName ) );
								}

								currentMoveFrom = wit->second;
								currentMoveCookie = pevent->cookie;
							} else {
								/// Keep track of the IN_MOVED_FROM events to know
								/// if the IN_MOVED_TO event is also fired
								if ( currentMoveFrom ) {
									mMovedOutsideWatches.push_back(
										std::make_pair( currentMoveFrom, prevOldFileName ) );
								}

								currentMoveFrom = NULL;
								currentMoveCookie = -1;
							}
						}

						lastWasMovedFrom = ( pevent->mask & IN_MOVED_FROM ) != 0;
						if ( pevent->mask & IN_MOVED_FROM )
							prevOldFileName = std::string( (char*)pevent->name );
					}

					i += sizeof( struct inotify_event ) + pevent->len;
				}
			}
		} else {
			// Here means no event received
			// If last event is IN_MOVED_FROM, we assume no IN_MOVED_TO
			if ( currentMoveFrom ) {
				mMovedOutsideWatches.push_back(
					std::make_pair( currentMoveFrom, currentMoveFrom->OldFileName ) );
			}

			currentMoveFrom = NULL;
			currentMoveCookie = -1;
		}

		if ( !mMovedOutsideWatches.empty() ) {
			// We need to make a copy since the element mMovedOutsideWatches could be modified
			// during the iteration.
			std::vector<std::pair<WatcherInotify*, std::string>> movedOutsideWatches(
				mMovedOutsideWatches );

			/// In case that the IN_MOVED_TO is never fired means that the file was moved to other
			/// folder
			for ( std::vector<std::pair<WatcherInotify*, std::string>>::iterator it =
					  movedOutsideWatches.begin();
				  it != movedOutsideWatches.end(); ++it ) {

				// Skip if the watch has already being removed
				if ( mMovedOutsideWatches.size() != movedOutsideWatches.size() ) {
					bool found = false;
					for ( std::vector<std::pair<WatcherInotify*, std::string>>::iterator itm =
							  mMovedOutsideWatches.begin();
						  mMovedOutsideWatches.end() != itm; ++itm ) {
						if ( itm->first == it->first ) {
							found = true;
							break;
						}
					}
					if ( !found )
						continue;
				}

				Watcher* watch = ( *it ).first;
				const std::string& oldFileName = ( *it ).second;

				/// Check if the file move was a folder already being watched
				std::vector<Watcher*> eraseWatches;

				{
					Lock lock( mWatchesLock );

					for ( ; wit != mWatches.end(); ++wit ) {
						Watcher* oldWatch = wit->second;

						if ( oldWatch != watch &&
							 -1 != String::strStartsWith( watch->Directory + oldFileName + "/",
														  oldWatch->Directory ) ) {
							eraseWatches.push_back( oldWatch );
						}
					}
				}

				/// Remove invalid watches
				std::stable_sort( eraseWatches.begin(), eraseWatches.end(),
								  []( const Watcher* left, const Watcher* right ) {
									  return left->Directory < right->Directory;
								  } );

				if ( eraseWatches.empty() ) {
					handleAction( watch, oldFileName, IN_DELETE );
				} else {
					for ( std::vector<Watcher*>::reverse_iterator eit = eraseWatches.rbegin();
						  eit != eraseWatches.rend(); ++eit ) {
						Watcher* rmWatch = *eit;

						/// Create Delete event for removed watches that have been moved too
						if ( Watcher* cntWatch = watcherContainsDirectory( rmWatch->Directory ) ) {
							handleAction( cntWatch,
										  FileSystem::fileNameFromPath( rmWatch->Directory ),
										  IN_DELETE );
						}
					}
				}
			}

			mMovedOutsideWatches.clear();
		}
	} while ( mInitOK );

	delete[] buff;
}